

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc_extension.cc
# Opt level: O0

void __thiscall MallocExtension::GetHeapSample(MallocExtension *this,MallocExtensionWriter *writer)

{
  int iVar1;
  undefined4 extraout_var;
  uintptr_t uVar2;
  void **local_60;
  void **entry;
  char label [32];
  char *kErrorMsg;
  void **entries;
  MallocExtensionWriter *pMStack_18;
  int sample_period;
  MallocExtensionWriter *writer_local;
  MallocExtension *this_local;
  void **entries_00;
  
  entries._4_4_ = 0;
  pMStack_18 = writer;
  writer_local = (MallocExtensionWriter *)this;
  iVar1 = (*this->_vptr_MallocExtension[0x19])(this,(long)&entries + 4);
  entries_00 = (void **)CONCAT44(extraout_var,iVar1);
  if (entries_00 == (void **)0x0) {
    std::__cxx11::string::append((char *)pMStack_18,0x148b98);
  }
  else {
    snprintf((char *)&entry,0x20,"heap_v2/%d",(ulong)entries._4_4_);
    anon_unknown.dwarf_3fce3::PrintHeader(pMStack_18,(char *)&entry,entries_00);
    local_60 = entries_00;
    while( true ) {
      uVar2 = anon_unknown.dwarf_3fce3::Count(local_60);
      if (uVar2 == 0) break;
      anon_unknown.dwarf_3fce3::PrintStackEntry(pMStack_18,local_60);
      uVar2 = anon_unknown.dwarf_3fce3::Depth(local_60);
      local_60 = local_60 + uVar2 + 3;
    }
    if (entries_00 != (void **)0x0) {
      operator_delete__(entries_00);
    }
    DumpAddressMap(pMStack_18);
  }
  return;
}

Assistant:

void MallocExtension::GetHeapSample(MallocExtensionWriter* writer) {
  int sample_period = 0;
  void** entries = ReadStackTraces(&sample_period);
  if (entries == nullptr) {
    const char* const kErrorMsg =
        "This malloc implementation does not support sampling.\n"
        "As of 2005/01/26, only tcmalloc supports sampling, and\n"
        "you are probably running a binary that does not use\n"
        "tcmalloc.\n";
    writer->append(kErrorMsg, strlen(kErrorMsg));
    return;
  }

  char label[32];
  snprintf(label, sizeof(label), "heap_v2/%d", sample_period);
  PrintHeader(writer, label, entries);
  for (void** entry = entries; Count(entry) != 0; entry += 3 + Depth(entry)) {
    PrintStackEntry(writer, entry);
  }
  delete[] entries;

  DumpAddressMap(writer);
}